

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O3

void __thiscall
duckdb::LocalFileSecretStorage::WriteSecret
          (LocalFileSecretStorage *this,BaseSecret *secret,OnCreateConflict on_conflict)

{
  pointer pbVar1;
  undefined1 *puVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  long *plVar6;
  long *plVar7;
  string *b;
  undefined1 *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *split;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *directory;
  hugeint_t hVar9;
  hugeint_t input;
  FileOpenFlags open_flags;
  LocalFileSystem fs;
  string file_path;
  string temp_path;
  string sep;
  string extension_directory_prefix;
  ErrorData error;
  FileSystem local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  undefined1 local_678 [32];
  BaseSecret *local_658;
  undefined1 local_650 [32];
  undefined1 local_630 [16];
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_620;
  tuple<duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_> local_608;
  string *local_600;
  undefined1 local_5f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5e0;
  idx_t iStack_5d0;
  undefined8 local_5c8;
  string local_5c0;
  string local_5a0 [2];
  undefined1 local_560 [680];
  vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  local_2b8;
  _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
  local_298;
  _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
  local_248;
  _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
  local_1f8;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_1a8;
  _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
  local_158;
  _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
  local_108;
  _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
  local_b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_6a0._vptr_FileSystem = (_func_int **)&PTR__FileSystem_0196e5c8;
  directory = &this->secret_path;
  local_658 = secret;
  bVar5 = LocalFileSystem::DirectoryExists
                    ((LocalFileSystem *)&local_6a0,directory,
                     (optional_ptr<duckdb::FileOpener,_true>)0x0);
  if (!bVar5) {
    FileSystem::PathSeparator((string *)local_650,&local_6a0,directory);
    StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       *)local_678,directory,(string *)local_650);
    local_5f8._0_8_ = local_5f8 + 0x10;
    local_5f8._8_8_ = (pointer)0x0;
    local_5f8._16_8_ = local_5f8._16_8_ & 0xffffffffffffff00;
    pcVar3 = (this->secret_path)._M_dataplus._M_p;
    local_600 = directory;
    local_5a0[0]._M_dataplus._M_p = (pointer)&local_5a0[0].field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_5a0,pcVar3,pcVar3 + (this->secret_path)._M_string_length);
    local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5c0,local_650._0_8_,
               (pointer)((long)(_func_int ***)local_650._8_8_ + local_650._0_8_));
    bVar5 = StringUtil::StartsWith(local_5a0,&local_5c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
      operator_delete(local_5c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a0[0]._M_dataplus._M_p != &local_5a0[0].field_2) {
      operator_delete(local_5a0[0]._M_dataplus._M_p);
    }
    if (bVar5) {
      ::std::__cxx11::string::_M_assign((string *)local_5f8);
    }
    if (local_678._0_8_ != local_678._8_8_) {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678._0_8_;
      do {
        ::std::operator+(&local_698,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5f8,__rhs);
        plVar6 = (long *)::std::__cxx11::string::_M_append((char *)&local_698,local_650._0_8_);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_560._16_8_ = *plVar7;
          local_560._24_8_ = plVar6[3];
          local_560._0_8_ = local_560 + 0x10;
        }
        else {
          local_560._16_8_ = *plVar7;
          local_560._0_8_ = (long *)*plVar6;
        }
        local_560._8_8_ = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)local_5f8,(string *)local_560);
        if ((undefined1 *)local_560._0_8_ != local_560 + 0x10) {
          operator_delete((void *)local_560._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._M_dataplus._M_p != &local_698.field_2) {
          operator_delete(local_698._M_dataplus._M_p);
        }
        bVar5 = LocalFileSystem::DirectoryExists
                          ((LocalFileSystem *)&local_6a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5f8,(optional_ptr<duckdb::FileOpener,_true>)0x0);
        if (!bVar5) {
          LocalFileSystem::CreateDirectory
                    ((LocalFileSystem *)&local_6a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8,
                     (optional_ptr<duckdb::FileOpener,_true>)0x0);
        }
        __rhs = __rhs + 1;
      } while (__rhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_678._8_8_);
    }
    if ((undefined1 *)local_5f8._0_8_ != local_5f8 + 0x10) {
      operator_delete((void *)local_5f8._0_8_);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_678);
    directory = local_600;
    if ((undefined1 *)local_650._0_8_ != local_650 + 0x10) {
      operator_delete((void *)local_650._0_8_);
    }
  }
  pcVar3 = local_560 + 0x10;
  pcVar4 = (local_658->name)._M_dataplus._M_p;
  local_560._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_560,pcVar4,pcVar4 + (local_658->name)._M_string_length);
  ::std::__cxx11::string::append(local_560);
  b = (string *)local_560;
  FileSystem::JoinPath(&local_698,&local_6a0,directory,b);
  if ((pointer)local_560._0_8_ != pcVar3) {
    operator_delete((void *)local_560._0_8_);
  }
  local_560._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_560,local_698._M_dataplus._M_p,
             local_698._M_dataplus._M_p + local_698._M_string_length);
  ::std::__cxx11::string::append(local_560);
  hVar9 = UUID::GenerateRandomUUID();
  input.lower = hVar9.upper;
  input.upper = (int64_t)b;
  BaseUUID::ToString_abi_cxx11_((string *)local_650,(BaseUUID *)hVar9.lower,input);
  puVar2 = (undefined1 *)((long)(_func_int ***)local_650._8_8_ + local_560._8_8_);
  puVar8 = (undefined1 *)0xf;
  if ((pointer)local_560._0_8_ != pcVar3) {
    puVar8 = (undefined1 *)local_560._16_8_;
  }
  if (puVar8 < puVar2) {
    puVar8 = (undefined1 *)0xf;
    if ((undefined1 *)local_650._0_8_ != local_650 + 0x10) {
      puVar8 = (undefined1 *)local_650._16_8_;
    }
    if (puVar2 <= puVar8) {
      plVar6 = (long *)::std::__cxx11::string::replace
                                 ((ulong)local_650,0,(char *)0x0,local_560._0_8_);
      goto LAB_004aa471;
    }
  }
  plVar6 = (long *)::std::__cxx11::string::_M_append(local_560,local_650._0_8_);
LAB_004aa471:
  local_678._0_8_ = local_678 + 0x10;
  pbVar1 = (pointer)(plVar6 + 2);
  if ((pointer)*plVar6 == pbVar1) {
    local_678._16_8_ = (pbVar1->_M_dataplus)._M_p;
    local_678._24_8_ = plVar6[3];
  }
  else {
    local_678._16_8_ = (pbVar1->_M_dataplus)._M_p;
    local_678._0_8_ = (pointer)*plVar6;
  }
  local_678._8_8_ = plVar6[1];
  *plVar6 = (long)pbVar1;
  plVar6[1] = 0;
  *(undefined1 *)&(pbVar1->_M_dataplus)._M_p = 0;
  if ((undefined1 *)local_650._0_8_ != local_650 + 0x10) {
    operator_delete((void *)local_650._0_8_);
  }
  if ((pointer)local_560._0_8_ != pcVar3) {
    operator_delete((void *)local_560._0_8_);
  }
  bVar5 = LocalFileSystem::FileExists
                    ((LocalFileSystem *)&local_6a0,&local_698,
                     (optional_ptr<duckdb::FileOpener,_true>)0x0);
  if (bVar5) {
    LocalFileSystem::RemoveFile
              ((LocalFileSystem *)&local_6a0,&local_698,(optional_ptr<duckdb::FileOpener,_true>)0x0)
    ;
  }
  bVar5 = LocalFileSystem::FileExists
                    ((LocalFileSystem *)&local_6a0,(string *)local_678,
                     (optional_ptr<duckdb::FileOpener,_true>)0x0);
  if (bVar5) {
    LocalFileSystem::RemoveFile
              ((LocalFileSystem *)&local_6a0,(string *)local_678,
               (optional_ptr<duckdb::FileOpener,_true>)0x0);
  }
  open_flags.lock = NO_LOCK;
  open_flags.compression = UNCOMPRESSED;
  open_flags._10_6_ = 0;
  open_flags.flags = 0x52;
  BufferedFileWriter::BufferedFileWriter
            ((BufferedFileWriter *)local_650,&local_6a0,(string *)local_678,open_flags);
  local_5f8._0_8_ = (pointer)0x0;
  local_5f8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_5f8._16_8_ = 0;
  aStack_5e0._0_8_ = 0;
  aStack_5e0._8_8_ = 0;
  iStack_5d0 = 0;
  local_5c8._0_1_ = false;
  local_5c8._1_7_ = 0;
  SerializationCompatibility::Default();
  BinarySerializer::BinarySerializer
            ((BinarySerializer *)local_560,(WriteStream *)local_650,
             (SerializationOptions *)local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._8_8_ != &aStack_5e0) {
    operator_delete((void *)local_5f8._8_8_);
  }
  BinarySerializer::OnObjectBegin((BinarySerializer *)local_560);
  (*local_658->_vptr_BaseSecret[4])(local_658,local_560);
  BinarySerializer::OnObjectEnd((BinarySerializer *)local_560);
  BufferedFileWriter::Flush((BufferedFileWriter *)local_650);
  local_560._0_8_ = &PTR__BinarySerializer_019677d8;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  ::std::
  _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
  ::~_Deque_base(&local_b8);
  ::std::
  _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
  ::~_Deque_base(&local_108);
  ::std::
  _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
  ::~_Deque_base(&local_158);
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_1a8);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
  ::~_Deque_base(&local_1f8);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
  ::~_Deque_base(&local_248);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
  ::~_Deque_base(&local_298);
  ::std::
  vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  ::~vector(&local_2b8);
  Serializer::~Serializer((Serializer *)local_560);
  local_650._0_8_ = &PTR_WriteData_01967758;
  if (local_608.
      super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
      super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl !=
      (_Head_base<0UL,_duckdb::FileHandle_*,_false>)0x0) {
    (**(code **)(*(long *)local_608.
                          super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>
                          .super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl + 8))();
  }
  local_608.super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>)
       (_Head_base<0UL,_duckdb::FileHandle_*,_false>)0x0;
  if ((_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
      local_620._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0) {
    operator_delete__((void *)local_620._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  local_620._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
  if ((undefined1 *)local_650._16_8_ != local_630) {
    operator_delete((void *)local_650._16_8_);
  }
  LocalFileSystem::MoveFile
            ((LocalFileSystem *)&local_6a0,(string *)local_678,&local_698,
             (optional_ptr<duckdb::FileOpener,_true>)0x0);
  if ((pointer)local_678._0_8_ != (pointer)(local_678 + 0x10)) {
    operator_delete((void *)local_678._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  FileSystem::~FileSystem(&local_6a0);
  return;
}

Assistant:

void LocalFileSecretStorage::WriteSecret(const BaseSecret &secret, OnCreateConflict on_conflict) {
	LocalFileSystem fs;

	// We may need to create the secret dir here if the directory was not present during LocalFileSecretStorage
	// construction
	if (!fs.DirectoryExists(secret_path)) {
		// TODO: recursive directory creation should probably live in filesystem
		auto sep = fs.PathSeparator(secret_path);
		auto splits = StringUtil::Split(secret_path, sep);
		D_ASSERT(!splits.empty());
		string extension_directory_prefix;
		if (StringUtil::StartsWith(secret_path, sep)) {
			extension_directory_prefix = sep; // this is swallowed by Split otherwise
		}
		try {
			for (auto &split : splits) {
				extension_directory_prefix = extension_directory_prefix + split + sep;
				if (!fs.DirectoryExists(extension_directory_prefix)) {
					fs.CreateDirectory(extension_directory_prefix);
				}
			}
		} catch (std::exception &ex) {
			ErrorData error(ex);
			if (error.Type() == ExceptionType::IO) {
				throw IOException("Failed to initialize persistent storage directory. (original error: '%s')",
				                  error.RawMessage());
			}
			throw;
		}
	}

	string file_path = fs.JoinPath(secret_path, secret.GetName() + ".duckdb_secret");
	string temp_path = file_path + ".tmp-" + UUID::ToString(UUID::GenerateRandomUUID());

	// If persistent file already exists remove
	if (fs.FileExists(file_path)) {
		fs.RemoveFile(file_path);
	}
	// If temporary file already exists remove
	if (fs.FileExists(temp_path)) {
		fs.RemoveFile(temp_path);
	}

	WriteSecretFileToDisk(fs, temp_path, secret);

	fs.MoveFile(temp_path, file_path);
}